

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O0

void render_bg_affine(gba_ppu_t *ppu,gba_color_t (*line) [240],BGCNT_t *bgcnt,_Bool win0in,
                     _Bool win1in,_Bool winout,_Bool objin,bg_referencepoint_container_t *x,
                     bg_referencepoint_container_t *y,bg_rotation_scaling_t *pa,
                     bg_rotation_scaling_t *pb,bg_rotation_scaling_t *pc,bg_rotation_scaling_t *pd)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  bool bVar5;
  byte bVar6;
  byte in_CL;
  ushort *in_RDX;
  long in_RSI;
  ushort *in_RDI;
  byte in_R8B;
  byte in_R9B;
  byte in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  short *in_stack_00000020;
  uint8_t tid;
  short *in_stack_00000030;
  int se_number;
  uint32_t adjusted_y;
  uint32_t adjusted_x;
  int screen_x;
  int bg_height;
  int bg_width;
  uint32_t screen_base_addr;
  uint32_t character_base_addr;
  uint16_t *warr_1;
  _Bool winout_display;
  _Bool winobj_display;
  _Bool win1_display;
  _Bool win0_display;
  _Bool is_winout;
  _Bool is_winobj;
  _Bool is_win1in;
  _Bool is_win0in;
  uint32_t palette_address;
  uint8_t tile;
  uint32_t tile_address;
  int in_tile_offset;
  int tile_size;
  int in_tile_offset_divisor;
  uint16_t *warr;
  byte local_146;
  bool local_144;
  bool local_142;
  uint local_120;
  uint local_11c;
  int local_118;
  uint local_114;
  uint local_110;
  byte local_ad;
  
  uVar3 = *in_RDX;
  bVar1 = *(byte *)((long)in_RDX + 1);
  switch(*in_RDX >> 0xe) {
  case 0:
    local_110 = 0x80;
    local_114 = 0x80;
    break;
  case 1:
    local_110 = 0x100;
    local_114 = 0x100;
    break;
  case 2:
    local_110 = 0x200;
    local_114 = 0x200;
    break;
  case 3:
    local_110 = 0x400;
    local_114 = 0x400;
    break;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c",
            0x18e);
    fprintf(_stderr,"Unimplemented screen size: %d\n\x1b[0;m",(ulong)(*in_RDX >> 0xe));
    exit(1);
  }
  local_118 = 0;
  do {
    if (0xef < local_118) {
      return;
    }
    local_11c = (uint)(*(int *)(in_stack_00000010 + 4) + *in_stack_00000020 * local_118) >> 8;
    local_120 = (uint)(*(int *)(in_stack_00000018 + 4) + *in_stack_00000030 * local_118) >> 8;
    if ((*in_RDX >> 0xd & 1) != 0) {
      local_11c = local_11c % local_110;
      local_120 = local_120 % local_114;
    }
    if ((local_120 < local_114) && (local_11c < local_110)) {
      uVar4 = *in_RDI;
      local_142 = false;
      if (((int)(uint)(in_RDI[0x1f644] >> 8) <= local_118) &&
         (local_142 = false, local_118 <= (int)(uint)(in_RDI[0x1f644] & 0xff))) {
        local_142 = in_RDI[0x1f648] >> 8 <= uVar4 && uVar4 <= (in_RDI[0x1f648] & 0xff);
      }
      local_144 = false;
      if (((int)(uint)(in_RDI[0x1f646] >> 8) <= local_118) &&
         (local_144 = false, local_118 <= (int)(uint)(in_RDI[0x1f646] & 0xff))) {
        local_144 = in_RDI[0x1f64a] >> 8 <= uVar4 && uVar4 <= (in_RDI[0x1f64a] & 0xff);
      }
      bVar5 = true;
      if (!local_142) {
        bVar5 = local_144;
      }
      bVar6 = (byte)(in_RDI[0x1f61a] >> 0xe) & 1;
      local_146 = 1;
      bVar2 = bVar6;
      if (((((((byte)(in_RDI[0x1f61a] >> 0xd) & 1) == 0) ||
            (local_ad = in_CL & 1, bVar2 = local_146, !local_142)) &&
           ((bVar6 == 0 || (local_ad = in_R8B & 1, !local_144)))) &&
          ((-1 < (short)in_RDI[0x1f61a] ||
           (local_ad = in_stack_00000008 & 1,
           (*(byte *)((long)in_RDI + (long)local_118 + 0x26342) & 1) == 0)))) &&
         ((bVar2 == 0 || (local_ad = in_R9B & 1, bVar5)))) {
        local_ad = 1;
      }
      if (local_ad == 0) goto LAB_001499fb;
      bVar2 = *(byte *)((long)in_RDI +
                       (ulong)(((local_11c & 7) + (local_120 & 7) * 8) / 1 +
                              (uVar3 & 0xc) * 0x1000 +
                              (uint)*(byte *)((long)in_RDI +
                                             (ulong)((bVar1 & 0x1f) * 0x800 +
                                                    (local_11c >> 3) +
                                                    (local_120 >> 3) * (local_110 / 8)) + 0x26832) *
                              0x40) + 0x26832);
      *(undefined2 *)(in_RSI + (long)local_118 * 2) =
           *(undefined2 *)((long)in_RDI + (long)(int)((uint)bVar2 << 1) + 0x26432);
      *(ushort *)(in_RSI + (long)local_118 * 2) =
           *(ushort *)(in_RSI + (long)local_118 * 2) & 0x7fff | (ushort)(bVar2 == 0) << 0xf;
    }
    else {
LAB_001499fb:
      *(ushort *)(in_RSI + (long)local_118 * 2) = in_RDI[0x13219];
      *(ushort *)(in_RSI + (long)local_118 * 2) =
           *(ushort *)(in_RSI + (long)local_118 * 2) & 0x7fff | 0x8000;
    }
    local_118 = local_118 + 1;
  } while( true );
}

Assistant:

void render_bg_affine(gba_ppu_t* ppu, gba_color_t (*line)[GBA_SCREEN_X], BGCNT_t* bgcnt,
                      bool win0in, bool win1in, bool winout, bool objin,
                      bg_referencepoint_container_t* x, bg_referencepoint_container_t* y,
                      bg_rotation_scaling_t* pa, bg_rotation_scaling_t* pb, bg_rotation_scaling_t* pc, bg_rotation_scaling_t* pd) {
    // Tileset (like pattern tables in the NES)
    word character_base_addr = bgcnt->character_base_block * CHARBLOCK_SIZE;
    // Tile map (like nametables in the NES)
    word screen_base_addr = bgcnt->screen_base_block * SCREENBLOCK_SIZE;

    int bg_width;
    int bg_height;
    switch (bgcnt->screen_size) {
        case 0:
            bg_width = 128;
            bg_height = 128;
            break;
        case 1:
            bg_width = 256;
            bg_height = 256;
            break;
        case 2:
            bg_width = 512;
            bg_height = 512;
            break;
        case 3:
            bg_width = 1024;
            bg_height = 1024;
            break;
        default:
            logfatal("Unimplemented screen size: %d", bgcnt->screen_size);
    }

    for (int screen_x = 0; screen_x < GBA_SCREEN_X; screen_x++) {
        word adjusted_x = (word)(x->current.sraw + pa->sraw * screen_x) >> 8;
        word adjusted_y = (word)(y->current.sraw + pc->sraw * screen_x) >> 8;

        if (bgcnt->wraparound) {
            adjusted_x %= bg_width;
            adjusted_y %= bg_height;
        }

        if (adjusted_y < bg_height && adjusted_x < bg_width && should_render_pixel_window(ppu, screen_x, ppu->y, win0in, win1in, winout, objin)) {
            int se_number = (adjusted_x / 8) + (adjusted_y / 8) * (bg_width / 8);
            byte tid = ppu->vram[screen_base_addr + se_number];
            render_tile(ppu, tid, 0, line, screen_x, true, character_base_addr, adjusted_x % 8, adjusted_y % 8);
        } else {
            (*line)[screen_x].raw = half_from_byte_array(ppu->pram, 0);
            (*line)[screen_x].transparent = true;
        }
    }
}